

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkRenderingInputAttachmentIndexInfoKHR *info,ScratchAllocator *alloc)

{
  void *pvVar1;
  undefined4 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint32_t *puVar5;
  uint32_t *puVar6;
  undefined8 *puVar7;
  void *__dest;
  undefined4 *puVar8;
  size_t size;
  
  puVar7 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x30,0x10);
  if (puVar7 != (undefined8 *)0x0) {
    uVar3 = *(undefined8 *)info;
    pvVar1 = info->pNext;
    uVar4 = *(undefined8 *)&info->colorAttachmentCount;
    puVar5 = info->pColorAttachmentInputIndices;
    puVar6 = info->pStencilInputAttachmentIndex;
    puVar7[4] = info->pDepthInputAttachmentIndex;
    puVar7[5] = puVar6;
    puVar7[2] = uVar4;
    puVar7[3] = puVar5;
    *puVar7 = uVar3;
    puVar7[1] = pvVar1;
  }
  pvVar1 = (void *)puVar7[3];
  if (pvVar1 == (void *)0x0) goto LAB_0015be43;
  if ((ulong)info->colorAttachmentCount == 0) {
LAB_0015be3c:
    __dest = (void *)0x0;
  }
  else {
    size = (ulong)info->colorAttachmentCount << 2;
    __dest = ScratchAllocator::allocate_raw(alloc,size,0x10);
    if (__dest == (void *)0x0) goto LAB_0015be3c;
    memmove(__dest,pvVar1,size);
  }
  puVar7[3] = __dest;
LAB_0015be43:
  puVar2 = (undefined4 *)puVar7[4];
  if (puVar2 != (undefined4 *)0x0) {
    puVar8 = (undefined4 *)ScratchAllocator::allocate_raw(alloc,4,0x10);
    if (puVar8 != (undefined4 *)0x0) {
      *puVar8 = *puVar2;
    }
    puVar7[4] = puVar8;
  }
  puVar2 = (undefined4 *)puVar7[5];
  if (puVar2 != (undefined4 *)0x0) {
    puVar8 = (undefined4 *)ScratchAllocator::allocate_raw(alloc,4,0x10);
    if (puVar8 != (undefined4 *)0x0) {
      *puVar8 = *puVar2;
    }
    puVar7[5] = puVar8;
  }
  return puVar7;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkRenderingInputAttachmentIndexInfoKHR *info, ScratchAllocator &alloc)
{
	auto *loc_info = copy(info, 1, alloc);
	if (loc_info->pColorAttachmentInputIndices)
		loc_info->pColorAttachmentInputIndices = copy(loc_info->pColorAttachmentInputIndices, info->colorAttachmentCount, alloc);
	if (loc_info->pDepthInputAttachmentIndex)
		loc_info->pDepthInputAttachmentIndex = copy(loc_info->pDepthInputAttachmentIndex, 1, alloc);
	if (loc_info->pStencilInputAttachmentIndex)
		loc_info->pStencilInputAttachmentIndex = copy(loc_info->pStencilInputAttachmentIndex, 1, alloc);
	return loc_info;
}